

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void fixjump(FuncState *fs,int pc,int dest)

{
  int iVar1;
  int iVar2;
  uint *puVar3;
  int offset;
  Instruction *jmp;
  int dest_local;
  int pc_local;
  FuncState *fs_local;
  
  puVar3 = fs->f->code + pc;
  iVar1 = dest - (pc + 1);
  iVar2 = iVar1;
  if (iVar1 < 1) {
    iVar2 = -iVar1;
  }
  if (0x1ffff < iVar2) {
    luaX_syntaxerror(fs->ls,"control structure too long");
  }
  *puVar3 = *puVar3 & 0x3fff | (iVar1 + 0x1ffff) * 0x4000;
  return;
}

Assistant:

static void fixjump (FuncState *fs, int pc, int dest) {
  Instruction *jmp = &fs->f->code[pc];
  int offset = dest - (pc + 1);
  lua_assert(dest != NO_JUMP);
  if (!(-OFFSET_sJ <= offset && offset <= MAXARG_sJ - OFFSET_sJ))
    luaX_syntaxerror(fs->ls, "control structure too long");
  lua_assert(GET_OPCODE(*jmp) == OP_JMP);
  SETARG_sJ(*jmp, offset);
}